

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

int __thiscall PGSStreamReader::readPacket(PGSStreamReader *this,AVPacket *avPacket)

{
  ushort uVar1;
  ushort uVar2;
  PESPacket *this_00;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint8_t *puVar7;
  ostream *poVar8;
  uchar *puVar9;
  int64_t iVar10;
  pointer pPVar11;
  ulong uVar12;
  int64_t local_1a8;
  int64_t local_1a0;
  double local_190;
  int64_t local_178;
  int64_t local_170;
  int64_t local_168;
  int64_t local_158;
  int64_t local_150;
  int64_t local_148;
  int64_t local_138;
  int64_t local_130;
  int local_124;
  double local_120;
  bool local_e2;
  bool local_e1;
  uint local_d4;
  __normal_iterator<PGSStreamReader::PGSRenderedBlock_*,_std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>_>
  local_c8;
  __normal_iterator<PGSStreamReader::PGSRenderedBlock_*,_std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>_>
  local_c0;
  uint local_b4;
  int avLen;
  BitStreamException *e;
  int local_a0;
  int i_1;
  int i;
  byte local_8a;
  byte local_89;
  undefined1 local_88 [6];
  uint8_t number_of_windows;
  uint8_t number_of_composition_objects;
  BitStreamReader bitReader;
  uint16_t segment_len;
  uint8_t segment_type;
  int pesHeaderLen;
  PESPacket *pesPacket;
  int local_50;
  bool pesStartCode;
  bool pgStartCode;
  int avLen_1;
  uint scaled_size;
  uint size;
  uint16_t tmpHeight;
  uint16_t tmpWidth;
  __normal_iterator<PGSStreamReader::PGSRenderedBlock_*,_std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>_>
  local_38;
  const_iterator local_30;
  reference local_28;
  PGSRenderedBlock *block;
  AVPacket *avPacket_local;
  PGSStreamReader *this_local;
  
  avPacket->size = 0;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->codecID = 0xc;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = 0;
  avPacket->duration = 0;
  block = (PGSRenderedBlock *)avPacket;
  avPacket_local = (AVPacket *)this;
  bVar3 = std::
          vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
          ::empty(&this->m_renderedBlocks);
  if (bVar3) {
    if ((this->super_AbstractStreamReader).m_curPos == (uint8_t *)0x0) {
      this_local._4_4_ = 1;
    }
    else {
      if (this->m_video_height == 0) {
        intDecodeStream(this,(this->super_AbstractStreamReader).m_curPos,
                        (long)(this->super_AbstractStreamReader).m_bufEnd -
                        (long)(this->super_AbstractStreamReader).m_curPos);
        if (this->m_video_height == 0) {
          return 1;
        }
        text_subtitles::TextToPGSConverter::enlargeCrop
                  (this->m_render,this->m_video_width,this->m_video_height,
                   (uint16_t *)((long)&scaled_size + 2),(uint16_t *)&scaled_size);
        if ((this->m_scaled_width == 0) ||
           (local_e1 = true, this->m_scaled_width == scaled_size._2_2_)) {
          local_e2 = false;
          if (this->m_scaled_height != 0) {
            local_e2 = this->m_scaled_height != (uint16_t)scaled_size;
          }
          local_e1 = local_e2;
        }
        this->m_needRescale = local_e1;
        if ((this->m_needRescale & 1U) != 0) {
          uVar5 = (uint)this->m_video_width * (uint)this->m_video_height;
          uVar1 = this->m_scaled_width;
          uVar2 = this->m_scaled_height;
          uVar12 = (ulong)uVar5;
          if (uVar12 == 0) {
            uVar12 = 0xffffffffffffffff;
          }
          puVar7 = (uint8_t *)operator_new__(uVar12);
          *puVar7 = 0xff;
          memset(puVar7 + 1,0,uVar12 - 1);
          this->m_imgBuffer = puVar7;
          uVar12 = (ulong)(uVar5 * 4);
          puVar7 = (uint8_t *)operator_new__(uVar12);
          memset(puVar7,0,uVar12);
          this->m_rgbBuffer = puVar7;
          uVar12 = (ulong)((uint)uVar1 * (uint)uVar2 * 4);
          puVar7 = (uint8_t *)operator_new__(uVar12);
          memset(puVar7,0,uVar12);
          this->m_scaledRgbBuffer = puVar7;
          puVar7 = (uint8_t *)
                   operator_new__((long)(int)((this->m_scaled_width + 0x10) *
                                              (uint)this->m_scaled_height + 0x4000));
          this->m_renderedData = puVar7;
          text_subtitles::TextToPGSConverter::setImageBuffer(this->m_render,this->m_scaledRgbBuffer)
          ;
        }
        poVar8 = std::operator<<((ostream *)&std::cout,"Decoding PGS stream (track ");
        poVar8 = (ostream *)
                 std::ostream::operator<<(poVar8,(this->super_AbstractStreamReader).m_streamIndex);
        poVar8 = std::operator<<(poVar8,"): ");
        poVar8 = std::operator<<(poVar8," Resolution: ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_video_width);
        poVar8 = std::operator<<(poVar8,':');
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_video_height);
        poVar8 = std::operator<<(poVar8,"  Frame rate: ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_frame_rate);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        if ((this->m_newFps != 0.0) || (NAN(this->m_newFps))) {
          if (this->m_newFps - this->m_frame_rate < 0.0) {
            local_120 = -(this->m_newFps - this->m_frame_rate);
          }
          else {
            local_120 = this->m_newFps - this->m_frame_rate;
          }
          if (0.0001 < local_120) {
            poVar8 = std::operator<<((ostream *)&std::cout,"Change FPS from ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_frame_rate);
            poVar8 = std::operator<<(poVar8," to ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_newFps);
            poVar8 = std::operator<<(poVar8," for PGS stream #");
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               (poVar8,(this->super_AbstractStreamReader).m_streamIndex);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            sLastMsg = true;
            this->m_scale = this->m_frame_rate / this->m_newFps;
          }
        }
        if ((this->m_needRescale & 1U) != 0) {
          poVar8 = std::operator<<((ostream *)&std::cout,"Change PGS resolution from ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_video_width);
          poVar8 = std::operator<<(poVar8,':');
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_video_height);
          poVar8 = std::operator<<(poVar8," to ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_scaled_width);
          poVar8 = std::operator<<(poVar8,':');
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_scaled_height);
          poVar8 = std::operator<<(poVar8,". Scaling method: Bilinear interpolation");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          sLastMsg = true;
        }
      }
      if (this->m_state == stAVPacketFragmented) {
        local_50 = (int)this->m_avFragmentEnd - (int)(this->super_AbstractStreamReader).m_curPos;
        if (local_50 < 0x8001) {
          this->m_state = stParsePES;
        }
        else {
          local_50 = 0x8000;
        }
        block->pts = this->m_lastPTS;
        block->dts = this->m_lastDTS;
        *(uint8_t **)&block->len = (this->super_AbstractStreamReader).m_curPos;
        if ((this->m_needRescale & 1U) == 0) {
          local_124 = local_50;
        }
        else {
          local_124 = 0;
        }
        *(int *)&block->data = local_124;
        (this->super_AbstractStreamReader).m_curPos =
             (this->super_AbstractStreamReader).m_curPos + local_50;
        this->m_processedSize = (long)local_50 + this->m_processedSize;
        if ((this->m_needRescale & 1U) != 0) {
          if (block->dts < 0) {
            local_130 = 0;
          }
          else {
            local_130 = block->dts;
          }
          block->dts = local_130;
          if (block->pts < 0) {
            local_138 = 0;
          }
          else {
            local_138 = block->pts;
          }
          block->pts = local_138;
        }
        this_local._4_4_ = 0;
      }
      else if ((long)(this->super_AbstractStreamReader).m_bufEnd -
               (long)(this->super_AbstractStreamReader).m_curPos < 3) {
        (this->super_AbstractStreamReader).m_tmpBufferLen =
             (long)(this->super_AbstractStreamReader).m_bufEnd -
             (long)(this->super_AbstractStreamReader).m_curPos;
        puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           (&this->m_tmpBuffer);
        memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                (this->super_AbstractStreamReader).m_tmpBufferLen);
        this_local._4_4_ = 1;
      }
      else {
        bVar3 = false;
        if (*(this->super_AbstractStreamReader).m_curPos == 'P') {
          bVar3 = (this->super_AbstractStreamReader).m_curPos[1] == 'G';
        }
        if (bVar3) {
          if ((long)(this->super_AbstractStreamReader).m_bufEnd -
              (long)(this->super_AbstractStreamReader).m_curPos < 10) {
            (this->super_AbstractStreamReader).m_tmpBufferLen =
                 (long)(this->super_AbstractStreamReader).m_bufEnd -
                 (long)(this->super_AbstractStreamReader).m_curPos;
            puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&this->m_tmpBuffer);
            memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                    (this->super_AbstractStreamReader).m_tmpBufferLen);
            this_local._4_4_ = 1;
          }
          else {
            iVar10 = getTimeValueNano((this->super_AbstractStreamReader).m_curPos + 2);
            this->m_lastPTS = (long)((double)iVar10 * this->m_scale);
            if (this->m_lastPTS < this->m_maxPTS) {
              local_148 = this->m_maxPTS;
            }
            else {
              local_148 = this->m_lastPTS;
            }
            this->m_maxPTS = local_148;
            iVar10 = getTimeValueNano((this->super_AbstractStreamReader).m_curPos + 6);
            this->m_lastDTS = (long)((double)iVar10 * this->m_scale);
            if (this->m_lastDTS == 0) {
              this->m_lastDTS = this->m_lastPTS;
            }
            (this->super_AbstractStreamReader).m_curPos =
                 (this->super_AbstractStreamReader).m_curPos + 10;
            this->m_processedSize = this->m_processedSize + 10;
            this->m_state = stParsePGS;
            block->pts = this->m_lastPTS;
            block->dts = this->m_lastDTS;
            this->m_isNewFrame = true;
            if ((this->m_needRescale & 1U) != 0) {
              if (block->dts < 0) {
                local_150 = 0;
              }
              else {
                local_150 = block->dts;
              }
              block->dts = local_150;
              if (block->pts < 0) {
                local_158 = 0;
              }
              else {
                local_158 = block->pts;
              }
              block->pts = local_158;
            }
            this_local._4_4_ = 0;
          }
        }
        else {
          bVar3 = false;
          if ((*(this->super_AbstractStreamReader).m_curPos == '\0') &&
             (bVar3 = false, (this->super_AbstractStreamReader).m_curPos[1] == '\0')) {
            bVar3 = (this->super_AbstractStreamReader).m_curPos[2] == '\x01';
          }
          if (bVar3) {
            if ((long)(this->super_AbstractStreamReader).m_bufEnd -
                (long)(this->super_AbstractStreamReader).m_curPos < 8) {
              (this->super_AbstractStreamReader).m_tmpBufferLen =
                   (long)(this->super_AbstractStreamReader).m_bufEnd -
                   (long)(this->super_AbstractStreamReader).m_curPos;
              puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 (&this->m_tmpBuffer);
              memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                      (this->super_AbstractStreamReader).m_tmpBufferLen);
              this_local._4_4_ = 1;
            }
            else {
              this_00 = (PESPacket *)(this->super_AbstractStreamReader).m_curPos;
              bVar4 = PESPacket::getHeaderLength(this_00);
              bitReader.m_bitLeft = (uint)bVar4;
              if ((long)(this->super_AbstractStreamReader).m_bufEnd -
                  (long)(this->super_AbstractStreamReader).m_curPos < (long)(int)bitReader.m_bitLeft
                 ) {
                (this->super_AbstractStreamReader).m_tmpBufferLen =
                     (long)(this->super_AbstractStreamReader).m_bufEnd -
                     (long)(this->super_AbstractStreamReader).m_curPos;
                puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   (&this->m_tmpBuffer);
                memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                        (this->super_AbstractStreamReader).m_tmpBufferLen);
                this_local._4_4_ = 1;
              }
              else {
                if ((this_00->flagsLo & 0x80) != 0) {
                  iVar10 = PESPacket::getPts(this_00);
                  iVar10 = getTimeValueNano(iVar10);
                  this->m_lastPTS = iVar10;
                  this->m_lastDTS = iVar10;
                  if (this->m_maxPTS < this->m_lastPTS) {
                    local_168 = this->m_lastPTS;
                  }
                  else {
                    local_168 = this->m_maxPTS;
                  }
                  this->m_maxPTS = local_168;
                }
                if ((this_00->flagsLo & 0xc0) == 0xc0) {
                  iVar10 = PESPacket::getDts(this_00);
                  iVar10 = getTimeValueNano(iVar10);
                  this->m_lastDTS = iVar10;
                }
                (this->super_AbstractStreamReader).m_curPos =
                     (this->super_AbstractStreamReader).m_curPos + (int)bitReader.m_bitLeft;
                this->m_processedSize = (long)(int)bitReader.m_bitLeft + this->m_processedSize;
                this->m_state = stParsePGS;
                block->pts = this->m_lastPTS;
                block->dts = this->m_lastDTS;
                this->m_isNewFrame = true;
                if ((this->m_needRescale & 1U) != 0) {
                  if (block->dts < 0) {
                    local_170 = 0;
                  }
                  else {
                    local_170 = block->dts;
                  }
                  block->dts = local_170;
                  if (block->pts < 0) {
                    local_178 = 0;
                  }
                  else {
                    local_178 = block->pts;
                  }
                  block->pts = local_178;
                }
                this_local._4_4_ = 0;
              }
            }
          }
          else {
            *(uint8_t **)&block->len = (this->super_AbstractStreamReader).m_curPos;
            if ((long)(this->super_AbstractStreamReader).m_bufEnd -
                (long)(this->super_AbstractStreamReader).m_curPos < 3) {
              (this->super_AbstractStreamReader).m_tmpBufferLen =
                   (long)(this->super_AbstractStreamReader).m_bufEnd -
                   (long)(this->super_AbstractStreamReader).m_curPos;
              puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 (&this->m_tmpBuffer);
              memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                      (this->super_AbstractStreamReader).m_tmpBufferLen);
              this_local._4_4_ = 1;
            }
            else {
              bitReader.m_curVal._3_1_ = *(this->super_AbstractStreamReader).m_curPos;
              bitReader.m_curVal._0_2_ = AV_RB16((this->super_AbstractStreamReader).m_curPos + 1);
              if ((long)(this->super_AbstractStreamReader).m_bufEnd -
                  (long)(this->super_AbstractStreamReader).m_curPos <
                  (long)((ulong)(uint16_t)bitReader.m_curVal + 3)) {
                (this->super_AbstractStreamReader).m_tmpBufferLen =
                     (long)(this->super_AbstractStreamReader).m_bufEnd -
                     (long)(this->super_AbstractStreamReader).m_curPos;
                puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   (&this->m_tmpBuffer);
                memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                        (this->super_AbstractStreamReader).m_tmpBufferLen);
                this_local._4_4_ = 1;
              }
              else {
                (this->super_AbstractStreamReader).m_curPos =
                     (this->super_AbstractStreamReader).m_curPos + 3;
                BitStreamReader::BitStreamReader((BitStreamReader *)local_88);
                if (bitReader.m_curVal._3_1_ == '\x14') {
                  if ((this->m_needRescale & 1U) != 0) {
                    puVar7 = (this->super_AbstractStreamReader).m_curPos;
                    readPalette(this,puVar7,puVar7 + (uint16_t)bitReader.m_curVal);
                  }
                }
                else if (bitReader.m_curVal._3_1_ == '\x15') {
                  if ((this->m_needRescale & 1U) != 0) {
                    memset(this->m_imgBuffer,0xff,
                           (ulong)this->m_video_width * (ulong)this->m_video_height);
                    memset(this->m_rgbBuffer,0,
                           (ulong)this->m_video_width * (ulong)this->m_video_height * 4);
                    memset(this->m_scaledRgbBuffer,0,
                           (ulong)this->m_scaled_width * (ulong)this->m_scaled_height * 4);
                    puVar7 = (this->super_AbstractStreamReader).m_curPos;
                    iVar6 = readObjectDef(this,puVar7,puVar7 + (uint16_t)bitReader.m_curVal);
                    if (iVar6 == 1) {
                      (this->super_AbstractStreamReader).m_tmpBufferLen =
                           (long)(this->super_AbstractStreamReader).m_bufEnd -
                           (long)(this->super_AbstractStreamReader).m_curPos;
                      puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         (&this->m_tmpBuffer);
                      memmove(puVar9,(this->super_AbstractStreamReader).m_curPos,
                              (this->super_AbstractStreamReader).m_tmpBufferLen);
                      return 1;
                    }
                    renderTextShow(this,this->m_maxPTS);
                  }
                }
                else if (bitReader.m_curVal._3_1_ == '\x16') {
                  if (this->m_scale - 1.0 < 0.0) {
                    local_190 = -(this->m_scale - 1.0);
                  }
                  else {
                    local_190 = this->m_scale - 1.0;
                  }
                  if (0.0001 < local_190) {
                    iVar6 = calcFpsIndex(this->m_newFps);
                    (this->super_AbstractStreamReader).m_curPos[4] = (uint8_t)(iVar6 << 4);
                  }
                  BitStreamReader::setBuffer
                            ((BitStreamReader *)local_88,(this->super_AbstractStreamReader).m_curPos
                             ,(this->super_AbstractStreamReader).m_bufEnd);
                  video_descriptor(this,(BitStreamReader *)local_88);
                  composition_descriptor(this,(BitStreamReader *)local_88);
                  BitStreamReader::skipBits((BitStreamReader *)local_88,0x10);
                  local_89 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_88,8);
                  for (local_a0 = 0; local_a0 < (int)(uint)local_89; local_a0 = local_a0 + 1) {
                    composition_object(this,(BitStreamReader *)local_88);
                  }
                  if ((this->composition_state != csEpochStart) && ((this->m_needRescale & 1U) != 0)
                     ) {
                    renderTextHide(this,this->m_maxPTS);
                  }
                }
                else if (bitReader.m_curVal._3_1_ == '\x17') {
                  BitStreamReader::setBuffer
                            ((BitStreamReader *)local_88,(this->super_AbstractStreamReader).m_curPos
                             ,(this->super_AbstractStreamReader).m_bufEnd);
                  local_8a = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_88,8);
                  for (e._4_4_ = 0; e._4_4_ < (int)(uint)local_8a; e._4_4_ = e._4_4_ + 1) {
                    pgs_window((BitStreamReader *)local_88);
                  }
                }
                block->pts = this->m_lastPTS;
                block->dts = this->m_lastDTS;
                if ((this->m_isNewFrame & 1U) != 0) {
                  if ((this->m_needRescale & 1U) == 0) {
                    *(int *)&block[1].pts = (int)block[1].pts + 4;
                  }
                  this->m_isNewFrame = false;
                }
                local_b4 = (uint)(uint16_t)bitReader.m_curVal;
                if (0x7ffd < local_b4) {
                  local_b4 = 0x7ffd;
                  this->m_state = stAVPacketFragmented;
                  this->m_avFragmentEnd =
                       (this->super_AbstractStreamReader).m_curPos +
                       (int)(uint)(uint16_t)bitReader.m_curVal;
                }
                (this->super_AbstractStreamReader).m_curPos =
                     (this->super_AbstractStreamReader).m_curPos + (int)local_b4;
                this->m_processedSize = (long)(int)(local_b4 + 3) + this->m_processedSize;
                *(uint *)&block->data = local_b4 + 3;
                if ((this->m_needRescale & 1U) != 0) {
                  bVar3 = std::
                          vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                          ::empty(&this->m_renderedBlocks);
                  if (bVar3) {
                    if (block->dts < 0) {
                      local_1a0 = 0;
                    }
                    else {
                      local_1a0 = block->dts;
                    }
                    block->dts = local_1a0;
                    if (block->pts < 0) {
                      local_1a8 = 0;
                    }
                    else {
                      local_1a8 = block->pts;
                    }
                    block->pts = local_1a8;
                  }
                  else {
                    local_c0._M_current =
                         (PGSRenderedBlock *)
                         std::
                         vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                         ::begin(&this->m_renderedBlocks);
                    pPVar11 = __gnu_cxx::
                              __normal_iterator<PGSStreamReader::PGSRenderedBlock_*,_std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>_>
                              ::operator->(&local_c0);
                    block->pts = pPVar11->pts * 0xe5b0;
                    local_c8._M_current =
                         (PGSRenderedBlock *)
                         std::
                         vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                         ::begin(&this->m_renderedBlocks);
                    pPVar11 = __gnu_cxx::
                              __normal_iterator<PGSStreamReader::PGSRenderedBlock_*,_std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>_>
                              ::operator->(&local_c8);
                    block->dts = pPVar11->dts * 0xe5b0;
                  }
                  *(undefined4 *)&block->data = 0;
                }
                this_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  else {
    if ((this->m_firstRenderedPacket & 1U) != 0) {
      *(int *)&block[1].pts = (int)block[1].pts + 4;
    }
    this->m_firstRenderedPacket = false;
    local_28 = std::
               vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
               ::operator[](&this->m_renderedBlocks,0);
    *(uint8_t **)&block->len = local_28->data;
    if (local_28->len < 0x8000) {
      local_d4 = local_28->len;
    }
    else {
      local_d4 = 0x8000;
    }
    *(uint *)&block->data = local_d4;
    block->pts = local_28->pts * 0xe5b0;
    block->dts = local_28->dts * 0xe5b0;
    local_28->data = local_28->data + *(int *)&block->data;
    local_28->len = local_28->len - *(int *)&block->data;
    if (local_28->len == 0) {
      local_38._M_current =
           (PGSRenderedBlock *)
           std::
           vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
           ::begin(&this->m_renderedBlocks);
      __gnu_cxx::
      __normal_iterator<PGSStreamReader::PGSRenderedBlock_const*,std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>>
      ::__normal_iterator<PGSStreamReader::PGSRenderedBlock*>
                ((__normal_iterator<PGSStreamReader::PGSRenderedBlock_const*,std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>>
                  *)&local_30,&local_38);
      std::
      vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
      ::erase(&this->m_renderedBlocks,local_30);
      this->m_firstRenderedPacket = true;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int PGSStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.size = 0;
    avPacket.codec = this;
    avPacket.codecID = CODEC_S_PGS;
    avPacket.stream_index = m_streamIndex;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = 0;
    avPacket.duration = 0;

    if (!m_renderedBlocks.empty())
    {  // rendered data block (rescaled PGS). send it.
        if (m_firstRenderedPacket)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_firstRenderedPacket = false;
        PGSRenderedBlock& block = m_renderedBlocks[0];
        avPacket.data = block.data;
        avPacket.size = FFMIN(MAX_AV_PACKET_SIZE, block.len);
        avPacket.pts = block.pts * INT_FREQ_TO_TS_FREQ;
        avPacket.dts = block.dts * INT_FREQ_TO_TS_FREQ;
        block.data += avPacket.size;
        block.len -= avPacket.size;
        if (block.len == 0)
        {
            m_renderedBlocks.erase(m_renderedBlocks.begin());
            m_firstRenderedPacket = true;
        }
        return 0;
    }

    if (m_curPos == nullptr)
        return NEED_MORE_DATA;

    if (m_video_height == 0)
    {
        intDecodeStream(m_curPos, m_bufEnd - m_curPos);
        if (m_video_height == 0)
            return NEED_MORE_DATA;

        uint16_t tmpWidth;
        uint16_t tmpHeight;
        m_render->enlargeCrop(m_video_width, m_video_height, &tmpWidth, &tmpHeight);
        m_needRescale =
            (m_scaled_width && m_scaled_width != tmpWidth) || (m_scaled_height && m_scaled_height != tmpHeight);
        if (m_needRescale)
        {
            const unsigned size = m_video_width * m_video_height;
            const unsigned scaled_size = m_scaled_width * m_scaled_height;
            m_imgBuffer = new uint8_t[size]{0xff};
            m_rgbBuffer = new uint8_t[size << 2]{};
            m_scaledRgbBuffer = new uint8_t[scaled_size << 2]{};
            m_renderedData = new uint8_t[(m_scaled_width + 16) * m_scaled_height + 16384];
            m_render->setImageBuffer(m_scaledRgbBuffer);
        }
        LTRACE(LT_INFO, 2,
               "Decoding PGS stream (track " << m_streamIndex << "): "
                                             << " Resolution: " << m_video_width << ':' << m_video_height
                                             << "  Frame rate: " << m_frame_rate);
        if (m_newFps != 0.0 && fabs(m_newFps - m_frame_rate) > 1e-4)
        {
            LTRACE(LT_INFO, 2,
                   "Change FPS from " << m_frame_rate << " to " << m_newFps << " for PGS stream #" << m_streamIndex);
            m_scale = m_frame_rate / m_newFps;
        }
        if (m_needRescale)
            LTRACE(LT_INFO, 2,
                   "Change PGS resolution from " << m_video_width << ':' << m_video_height << " to " << m_scaled_width
                                                 << ':' << m_scaled_height
                                                 << ". Scaling method: Bilinear interpolation");
    }

    if (m_state == State::stAVPacketFragmented)
    {
        int avLen = static_cast<int>(m_avFragmentEnd - m_curPos);
        if (avLen > MAX_AV_PACKET_SIZE)
        {
            avLen = MAX_AV_PACKET_SIZE;
        }
        else
            m_state = State::stParsePES;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        avPacket.data = m_curPos;
        avPacket.size = m_needRescale ? 0 : avLen;
        m_curPos += avLen;
        m_processedSize += avLen;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const bool pgStartCode = m_curPos[0] == 'P' && m_curPos[1] == 'G';
    if (pgStartCode)
    {
        if (m_bufEnd - m_curPos < 10)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        m_lastPTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 2)) * m_scale);
        m_maxPTS = FFMAX(m_maxPTS, m_lastPTS);
        m_lastDTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 6)) * m_scale);
        if (m_lastDTS == 0)
            m_lastDTS = m_lastPTS;
        m_curPos += 10;
        m_processedSize += 10;
        m_state = State::stParsePGS;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;

        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    const bool pesStartCode = m_curPos[0] == 0 && m_curPos[1] == 0 && m_curPos[2] == 01;

    if (pesStartCode)
    {
        if (m_bufEnd - m_curPos < 8)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        const auto pesPacket = reinterpret_cast<PESPacket*>(m_curPos);
        const int pesHeaderLen = pesPacket->getHeaderLength();
        // if (m_bufEnd - m_curPos < pesHeaderLen+1) {
        if (m_bufEnd - m_curPos < pesHeaderLen)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        if (pesPacket->flagsLo & 0x80)
        {  // pts exists
            m_lastDTS = m_lastPTS = getTimeValueNano(pesPacket->getPts());
            m_maxPTS = FFMAX(m_lastPTS, m_maxPTS);
        }
        if ((pesPacket->flagsLo & 0xc0) == 0xc0)  // dts exists
            m_lastDTS = getTimeValueNano(pesPacket->getDts());
        m_curPos += pesHeaderLen;
        m_processedSize += pesHeaderLen;
        m_state = State::stParsePGS;

        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;
        // m_afterPesByte = *m_curPos;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    avPacket.data = m_curPos;
    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const uint8_t segment_type = *m_curPos;
    const auto segment_len = AV_RB16(m_curPos + 1);
    if (m_bufEnd - m_curPos < 3ll + segment_len)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    m_curPos += 3;
    BitStreamReader bitReader{};
    try
    {
        uint8_t number_of_composition_objects, number_of_windows;
        switch (segment_type)
        {
        case PALETTE_DEF_SEGMENT:
            // pallete definition
            // m_palleteID = m_curPos[0];
            // m_paletteVersion = m_curPos[1];
            if (m_needRescale)
                readPalette(m_curPos, m_curPos + segment_len);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " palette definition");
            break;
        case OBJECT_DEF_SEGMENT:
            // object definition
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " object definition size " << segment_len
            //	  << " objectID=" << (int)m_curPos[0] << " version=" << (int) m_curPos[2]);
            if (m_needRescale)
            {
                memset(m_imgBuffer, 0xff, static_cast<size_t>(m_video_width) * m_video_height);
                memset(m_rgbBuffer, 0x00, static_cast<size_t>(m_video_width) * m_video_height * 4);
                memset(m_scaledRgbBuffer, 0x00, static_cast<size_t>(m_scaled_width) * m_scaled_height * 4);
                if (readObjectDef(m_curPos, m_curPos + segment_len) == NEED_MORE_DATA)
                {
                    m_tmpBufferLen = m_bufEnd - m_curPos;
                    memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
                    return NEED_MORE_DATA;
                }
                renderTextShow(m_maxPTS);
            }
            break;
        case PCS_DEF_SEGMENT:
            // Presentation Composition Segment
            if (fabs(m_scale - 1.0) > 1e-4)
                m_curPos[4] = static_cast<uint8_t>(calcFpsIndex(m_newFps) << 4);
            bitReader.setBuffer(m_curPos, m_bufEnd);
            video_descriptor(bitReader);
            composition_descriptor(bitReader);

            bitReader.skipBits(16);  // palette_update_flag, palette_id_ref
            number_of_composition_objects = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_composition_objects; i++)
            {
                composition_object(bitReader);
            }
            if (composition_state != CompositionState::csEpochStart && m_needRescale)
                renderTextHide(m_maxPTS);
            break;
        case WINDOWS_DEF_SEGMENT:
            // Window Definition Segment
            bitReader.setBuffer(m_curPos, m_bufEnd);
            number_of_windows = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_windows; i++) pgs_window(bitReader);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Window Definition Segment");
            break;
        case 0x18:
            // Interactive Composition Segment
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Interactive Composition Segment");
        case 0x80:
            // End of Display Set Segment
            // m_end_display_time = get_pts(curPos);
            // curPos += 5;
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " END");
        case 0x81:
        case 0x82:
            // Used by HDMV Text subtitle streams
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " TEXT DATA");
        default:
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " unknown type " << (int)segment_type);
            break;
        }
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NEED_MORE_DATA;
    }
    avPacket.pts = m_lastPTS;
    avPacket.dts = m_lastDTS;
    if (m_isNewFrame)
    {
        if (!m_needRescale)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_isNewFrame = false;
    }

    int avLen = segment_len;
    if (avLen > MAX_AV_PACKET_SIZE - 3)
    {
        avLen = MAX_AV_PACKET_SIZE - 3;
        m_state = State::stAVPacketFragmented;
        m_avFragmentEnd = m_curPos + segment_len;
    }
    m_curPos += avLen;
    m_processedSize += 3 + avLen;
    avPacket.size = 3 + avLen;
    if (m_needRescale)
    {
        if (!m_renderedBlocks.empty())
        {
            avPacket.pts = m_renderedBlocks.begin()->pts * INT_FREQ_TO_TS_FREQ;
            avPacket.dts = m_renderedBlocks.begin()->dts * INT_FREQ_TO_TS_FREQ;
        }
        else
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        avPacket.size = 0;  // skip source palette object
    }
    return 0;
}